

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

void append_entry_w(wchar_t **wp,wchar_t *prefix,wchar_t tag,wchar_t *wname,wchar_t perm,wchar_t id)

{
  wchar_t *pwVar1;
  size_t sVar2;
  wchar_t wVar3;
  wchar_t local_30;
  wchar_t id_local;
  wchar_t perm_local;
  wchar_t *wname_local;
  wchar_t tag_local;
  wchar_t *prefix_local;
  wchar_t **wp_local;
  
  if (prefix != (wchar_t *)0x0) {
    wcscpy(*wp,prefix);
    sVar2 = wcslen(*wp);
    *wp = *wp + sVar2;
  }
  local_30 = id;
  _id_local = wname;
  switch(tag) {
  case L'✒':
    _id_local = (wchar_t *)0x0;
    local_30 = L'\xffffffff';
  case L'✑':
    wcscpy(*wp,anon_var_dwarf_83936);
    break;
  case L'✔':
    _id_local = (wchar_t *)0x0;
    local_30 = L'\xffffffff';
  case L'✓':
    wcscpy(*wp,anon_var_dwarf_8394d);
    break;
  case L'✕':
    wcscpy(*wp,anon_var_dwarf_8396f);
    _id_local = (wchar_t *)0x0;
    local_30 = L'\xffffffff';
    break;
  case L'✖':
    wcscpy(*wp,anon_var_dwarf_83964);
    _id_local = (wchar_t *)0x0;
    local_30 = L'\xffffffff';
  }
  sVar2 = wcslen(*wp);
  *wp = *wp + sVar2;
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = L':';
  if (_id_local == (wchar_t *)0x0) {
    if ((tag == L'✑') || (tag == L'✓')) {
      append_id_w(wp,local_30);
      local_30 = L'\xffffffff';
    }
  }
  else {
    wcscpy(*wp,_id_local);
    sVar2 = wcslen(*wp);
    *wp = *wp + sVar2;
  }
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = L':';
  wVar3 = L'-';
  if ((perm & 0x124U) != 0) {
    wVar3 = L'r';
  }
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = wVar3;
  wVar3 = L'-';
  if ((perm & 0x92U) != 0) {
    wVar3 = L'w';
  }
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = wVar3;
  wVar3 = L'-';
  if ((perm & 0x49U) != 0) {
    wVar3 = L'x';
  }
  pwVar1 = *wp;
  *wp = pwVar1 + 1;
  *pwVar1 = wVar3;
  if (local_30 != L'\xffffffff') {
    pwVar1 = *wp;
    *wp = pwVar1 + 1;
    *pwVar1 = L':';
    append_id_w(wp,local_30);
  }
  **wp = L'\0';
  return;
}

Assistant:

static void
append_entry_w(wchar_t **wp, const wchar_t *prefix, int tag,
    const wchar_t *wname, int perm, int id)
{
	if (prefix != NULL) {
		wcscpy(*wp, prefix);
		*wp += wcslen(*wp);
	}
	switch (tag) {
	case ARCHIVE_ENTRY_ACL_USER_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_USER:
		wcscpy(*wp, L"user");
		break;
	case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
		wname = NULL;
		id = -1;
		/* FALLTHROUGH */
	case ARCHIVE_ENTRY_ACL_GROUP:
		wcscpy(*wp, L"group");
		break;
	case ARCHIVE_ENTRY_ACL_MASK:
		wcscpy(*wp, L"mask");
		wname = NULL;
		id = -1;
		break;
	case ARCHIVE_ENTRY_ACL_OTHER:
		wcscpy(*wp, L"other");
		wname = NULL;
		id = -1;
		break;
	}
	*wp += wcslen(*wp);
	*(*wp)++ = L':';
	if (wname != NULL) {
		wcscpy(*wp, wname);
		*wp += wcslen(*wp);
	} else if (tag == ARCHIVE_ENTRY_ACL_USER
	    || tag == ARCHIVE_ENTRY_ACL_GROUP) {
		append_id_w(wp, id);
		id = -1;
	}
	*(*wp)++ = L':';
	*(*wp)++ = (perm & 0444) ? L'r' : L'-';
	*(*wp)++ = (perm & 0222) ? L'w' : L'-';
	*(*wp)++ = (perm & 0111) ? L'x' : L'-';
	if (id != -1) {
		*(*wp)++ = L':';
		append_id_w(wp, id);
	}
	**wp = L'\0';
}